

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

int Alg::cal_k_min(vector<double,_std::allocator<double>_> *budget_list,double budget)

{
  iterator iVar1;
  iterator iVar2;
  size_type sVar3;
  reference pvVar4;
  undefined4 local_38;
  int i;
  undefined4 local_1c;
  double dStack_18;
  int count;
  double budget_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  
  local_1c = 0;
  iVar1 = std::vector<double,_std::allocator<double>_>::begin(budget_list);
  iVar2 = std::vector<double,_std::allocator<double>_>::end(budget_list);
  std::
  sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::greater<double>>
            (iVar1._M_current,iVar2._M_current);
  local_38 = 0;
  dStack_18 = budget;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(budget_list);
    if (sVar3 <= (ulong)(long)local_38) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(long)local_38);
    if (*pvVar4 <= dStack_18 && dStack_18 != *pvVar4) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](budget_list,(long)local_38);
      if (0.001 < ABS(*pvVar4)) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (budget_list,(long)local_38);
        dStack_18 = dStack_18 - *pvVar4;
        local_1c = local_1c + 1;
      }
    }
    local_38 = local_38 + 1;
  }
  return local_1c;
}

Assistant:

int Alg::cal_k_min(std::vector<double> budget_list, double budget) {
    int count = 0;
    std::sort(budget_list.begin(), budget_list.end(), std::greater<double>());
    for(int i = 0; i < budget_list.size(); i++) {
        if (budget > budget_list[i] && fabs(budget_list[i]) > 0.001) {
            budget = budget - budget_list[i];
            count = count + 1;
        }
    }
    return count;
}